

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

bool QtPrivate::isRightToLeft(QStringView string)

{
  const_iterator pQVar1;
  const_iterator pQVar2;
  char32_t ucs4;
  Direction DVar3;
  byte bVar4;
  uint in_ECX;
  int iVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QStringIterator local_48;
  long local_30;
  
  local_48.i = (const_iterator)string.m_data;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = local_48.i + string.m_size;
  iVar5 = 0;
  local_48.pos = local_48.i;
  do {
    while( true ) {
      while( true ) {
        pQVar2 = local_48.e;
        pQVar1 = local_48.pos;
        bVar4 = (byte)in_ECX;
        if (local_48.e <= local_48.pos) goto LAB_002f8a3a;
        ucs4 = QStringIterator::next(&local_48,L'�');
        DVar3 = QChar::direction(ucs4);
        in_ECX = DVar3 - DirLRI;
        if (2 < in_ECX) break;
        iVar5 = iVar5 + 1;
      }
      if (DVar3 == DirL) break;
      if ((DVar3 == DirR) || (DVar3 == DirAL)) {
        if (iVar5 == 0) {
          bVar4 = 1;
          goto LAB_002f8a3a;
        }
      }
      else if ((DVar3 == DirPDI) && (bVar6 = iVar5 == 0, iVar5 = iVar5 + -1, bVar6)) {
        iVar5 = 0;
      }
    }
  } while (iVar5 != 0);
  bVar4 = 0;
LAB_002f8a3a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)(pQVar1 < pQVar2 & bVar4);
}

Assistant:

bool QtPrivate::isRightToLeft(QStringView string) noexcept
{
    int isolateLevel = 0;

    for (QStringIterator i(string); i.hasNext();) {
        const char32_t c = i.next();

        switch (QChar::direction(c)) {
        case QChar::DirRLI:
        case QChar::DirLRI:
        case QChar::DirFSI:
            ++isolateLevel;
            break;
        case QChar::DirPDI:
            if (isolateLevel)
                --isolateLevel;
            break;
        case QChar::DirL:
            if (isolateLevel)
                break;
            return false;
        case QChar::DirR:
        case QChar::DirAL:
            if (isolateLevel)
                break;
            return true;
        case QChar::DirEN:
        case QChar::DirES:
        case QChar::DirET:
        case QChar::DirAN:
        case QChar::DirCS:
        case QChar::DirB:
        case QChar::DirS:
        case QChar::DirWS:
        case QChar::DirON:
        case QChar::DirLRE:
        case QChar::DirLRO:
        case QChar::DirRLE:
        case QChar::DirRLO:
        case QChar::DirPDF:
        case QChar::DirNSM:
        case QChar::DirBN:
            break;
        }
    }
    return false;
}